

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>
::inf_or_nan_writer::operator()
          (inf_or_nan_writer *this,
          back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> *it)

{
  undefined8 in_RAX;
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> bVar1;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  if (*this != (inf_or_nan_writer)0x0) {
    uStack_18 = CONCAT17(*this,(int7)in_RAX);
    std::__cxx11::list<char,_std::allocator<char>_>::push_back
              (it->container,(value_type *)((long)&uStack_18 + 7));
  }
  bVar1 = std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char_const*,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>>
                    (*(char **)(this + 8),*(char **)(this + 8) + 3,
                     (back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>)
                     it->container);
  it->container = (list<char,_std::allocator<char>_> *)bVar1;
  return;
}

Assistant:

void operator()(It &&it) const {
      if (sign)
        *it++ = static_cast<char_type>(sign);
      it = internal::copy_str<char_type>(
            str, str + static_cast<std::size_t>(INF_SIZE), it);
    }